

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

string * __thiscall
google::protobuf::internal::ExtensionSet::AddString_abi_cxx11_
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  undefined1 in_DL;
  long *in_RDI;
  Extension *extension;
  size_t n;
  Arena **in_stack_fffffffffffffe48;
  void *in_stack_fffffffffffffe50;
  type_info *in_stack_fffffffffffffe58;
  ArenaImpl *in_stack_fffffffffffffe60;
  _func_void_void_ptr *cleanup;
  Extension **in_stack_fffffffffffffe78;
  _func_void_void_ptr *n_00;
  ArenaImpl *in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  ExtensionSet *in_stack_fffffffffffffe90;
  undefined8 *local_88;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  
  bVar1 = MaybeNewExtension(in_stack_fffffffffffffe90,
                            (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                            (FieldDescriptor *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  if (bVar1) {
    *(undefined1 *)(local_88 + 1) = in_DL;
    *(undefined1 *)((long)local_88 + 9) = 1;
    *(undefined1 *)((long)local_88 + 0xb) = 0;
    cleanup = (_func_void_void_ptr *)*in_RDI;
    if (cleanup == (_func_void_void_ptr *)0x0) {
      local_38 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)operator_new(0x18);
      RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)0x4a868c);
    }
    else {
      n_00 = cleanup;
      AlignUpTo8(0x18);
      ArenaImpl::RecordAlloc
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                 (size_t)in_stack_fffffffffffffe50);
      ArenaImpl::AllocateAlignedAndAddCleanup(in_stack_fffffffffffffe80,(size_t)n_00,cleanup);
      local_38 = Arena::InternalHelper<google::protobuf::RepeatedPtrField<std::__cxx11::string>>::
                 Construct<google::protobuf::Arena*>
                           (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    }
    *local_88 = local_38;
  }
  pbVar2 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::Add((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x4a896a);
  return pbVar2;
}

Assistant:

std::string* ExtensionSet::AddString(int number, FieldType type,
                                     const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_STRING);
    extension->is_repeated = true;
    extension->is_packed = false;
    extension->repeated_string_value =
        Arena::CreateMessage<RepeatedPtrField<std::string>>(arena_);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, REPEATED_FIELD, STRING);
  }
  return extension->repeated_string_value->Add();
}